

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::ConsoleInterceptor::OnSetup(ConsoleInterceptor *this,SetupArgs *args)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  InterceptorConfig *this_00;
  string *raw;
  undefined1 local_698 [8];
  Decoder config;
  bool use_colors;
  int fd;
  SetupArgs *args_local;
  ConsoleInterceptor *this_local;
  
  config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99].id_ = 1;
  config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99].type_ = '\0';
  config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99]._15_1_ = 0;
  if ((anonymous_namespace)::g_output_fd_for_testing != 0) {
    config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99]._12_4_ =
         (anonymous_namespace)::g_output_fd_for_testing;
  }
  iVar2 = isatty(config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99]._12_4_);
  config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99].size_._3_1_ = iVar2 != 0;
  this_00 = protos::gen::DataSourceConfig::interceptor_config(args->config);
  raw = protos::gen::InterceptorConfig::console_config_raw_abi_cxx11_(this_00);
  protos::pbzero::ConsoleConfig_Decoder::ConsoleConfig_Decoder
            ((ConsoleConfig_Decoder *)local_698,raw);
  bVar1 = protos::pbzero::ConsoleConfig_Decoder::has_enable_colors
                    ((ConsoleConfig_Decoder *)local_698);
  if (bVar1) {
    config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99].size_._3_1_ =
         protos::pbzero::ConsoleConfig_Decoder::enable_colors((ConsoleConfig_Decoder *)local_698);
  }
  iVar3 = protos::pbzero::ConsoleConfig_Decoder::output((ConsoleConfig_Decoder *)local_698);
  if (iVar3 == 1) {
    config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99].id_ = 1;
    config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99].type_ = '\0';
    config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99]._15_1_ = 0;
  }
  else {
    iVar3 = protos::pbzero::ConsoleConfig_Decoder::output((ConsoleConfig_Decoder *)local_698);
    if (iVar3 == 2) {
      config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99].id_ = 2;
      config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99].type_ = '\0';
      config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99]._15_1_ = 0;
    }
  }
  this->fd_ = config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99]._12_4_;
  this->use_colors_ =
       (bool)(config.super_TypedProtoDecoder<2,_false>.on_stack_storage_[99].size_._3_1_ & 1);
  protos::pbzero::ConsoleConfig_Decoder::~ConsoleConfig_Decoder((ConsoleConfig_Decoder *)local_698);
  return;
}

Assistant:

void ConsoleInterceptor::OnSetup(const SetupArgs& args) {
  int fd = STDOUT_FILENO;
  if (g_output_fd_for_testing)
    fd = g_output_fd_for_testing;
#if !PERFETTO_BUILDFLAG(PERFETTO_OS_WIN) && \
    !PERFETTO_BUILDFLAG(PERFETTO_OS_WASM)
  bool use_colors = isatty(fd);
#else
  bool use_colors = false;
#endif
  protos::pbzero::ConsoleConfig::Decoder config(
      args.config.interceptor_config().console_config_raw());
  if (config.has_enable_colors())
    use_colors = config.enable_colors();
  if (config.output() == protos::pbzero::ConsoleConfig::OUTPUT_STDOUT) {
    fd = STDOUT_FILENO;
  } else if (config.output() == protos::pbzero::ConsoleConfig::OUTPUT_STDERR) {
    fd = STDERR_FILENO;
  }
  fd_ = fd;
  use_colors_ = use_colors;
}